

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int mbedtls_cipher_finish(mbedtls_cipher_context_t *ctx,uchar *output,size_t *olen)

{
  mbedtls_cipher_mode_t mVar1;
  mbedtls_operation_t mVar2;
  int iVar3;
  mbedtls_cipher_info_t *pmVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  
  pmVar4 = ctx->cipher_info;
  if (pmVar4 == (mbedtls_cipher_info_t *)0x0) {
    return -0x6100;
  }
  *olen = 0;
  mVar1 = pmVar4->mode;
  if (((mVar1 - MBEDTLS_MODE_CFB < 7) && ((0x5fU >> (mVar1 - MBEDTLS_MODE_CFB & 0x1f) & 1) != 0)) ||
     ((pmVar4->type & ~MBEDTLS_CIPHER_NULL) == MBEDTLS_CIPHER_CHACHA20)) {
    return 0;
  }
  if (mVar1 == MBEDTLS_MODE_CBC) {
    mVar2 = ctx->operation;
    if (mVar2 == MBEDTLS_ENCRYPT) {
      if (ctx->add_padding == (_func_void_uchar_ptr_size_t_size_t *)0x0) goto LAB_00116440;
      uVar5 = ctx->iv_size;
      if (uVar5 == 0) {
        uVar5 = (ulong)pmVar4->iv_size;
      }
      (*ctx->add_padding)(ctx->unprocessed_data,(long)(int)uVar5,ctx->unprocessed_len);
      pmVar4 = ctx->cipher_info;
      mVar2 = ctx->operation;
      sVar6 = (size_t)pmVar4->block_size;
    }
    else {
      sVar6 = (size_t)pmVar4->block_size;
      if (ctx->unprocessed_len != sVar6) {
        if (ctx->unprocessed_len != 0 ||
            ctx->add_padding != (_func_void_uchar_ptr_size_t_size_t *)0x0) {
          return -0x6280;
        }
        return 0;
      }
    }
    iVar3 = (*pmVar4->base->cbc_func)
                      (ctx->cipher_ctx,mVar2,sVar6,ctx->iv,ctx->unprocessed_data,output);
    if (iVar3 == 0) {
      if (ctx->operation == MBEDTLS_DECRYPT) {
        if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = ctx->cipher_info->block_size;
        }
        iVar3 = (*ctx->get_padding)(output,(size_t)uVar7,olen);
        return iVar3;
      }
      if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)ctx->cipher_info->block_size;
      }
      *olen = uVar5;
      iVar3 = 0;
    }
  }
  else {
    if (mVar1 != MBEDTLS_MODE_ECB) {
      return -0x6080;
    }
LAB_00116440:
    iVar3 = -0x6280;
    if (ctx->unprocessed_len == 0) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_cipher_finish( mbedtls_cipher_context_t *ctx,
                   unsigned char *output, size_t *olen )
{
    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( output != NULL );
    CIPHER_VALIDATE_RET( olen != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    *olen = 0;

    if( MBEDTLS_MODE_CFB == ctx->cipher_info->mode ||
        MBEDTLS_MODE_OFB == ctx->cipher_info->mode ||
        MBEDTLS_MODE_CTR == ctx->cipher_info->mode ||
        MBEDTLS_MODE_GCM == ctx->cipher_info->mode ||
        MBEDTLS_MODE_XTS == ctx->cipher_info->mode ||
        MBEDTLS_MODE_STREAM == ctx->cipher_info->mode )
    {
        return( 0 );
    }

    if ( ( MBEDTLS_CIPHER_CHACHA20          == ctx->cipher_info->type ) ||
         ( MBEDTLS_CIPHER_CHACHA20_POLY1305 == ctx->cipher_info->type ) )
    {
        return( 0 );
    }

    if( MBEDTLS_MODE_ECB == ctx->cipher_info->mode )
    {
        if( ctx->unprocessed_len != 0 )
            return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );

        return( 0 );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( MBEDTLS_MODE_CBC == ctx->cipher_info->mode )
    {
        int ret = 0;

        if( MBEDTLS_ENCRYPT == ctx->operation )
        {
            /* check for 'no padding' mode */
            if( NULL == ctx->add_padding )
            {
                if( 0 != ctx->unprocessed_len )
                    return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );

                return( 0 );
            }

            ctx->add_padding( ctx->unprocessed_data, mbedtls_cipher_get_iv_size( ctx ),
                    ctx->unprocessed_len );
        }
        else if( mbedtls_cipher_get_block_size( ctx ) != ctx->unprocessed_len )
        {
            /*
             * For decrypt operations, expect a full block,
             * or an empty block if no padding
             */
            if( NULL == ctx->add_padding && 0 == ctx->unprocessed_len )
                return( 0 );

            return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );
        }

        /* cipher block */
        if( 0 != ( ret = ctx->cipher_info->base->cbc_func( ctx->cipher_ctx,
                ctx->operation, mbedtls_cipher_get_block_size( ctx ), ctx->iv,
                ctx->unprocessed_data, output ) ) )
        {
            return( ret );
        }

        /* Set output size for decryption */
        if( MBEDTLS_DECRYPT == ctx->operation )
            return( ctx->get_padding( output, mbedtls_cipher_get_block_size( ctx ),
                                      olen ) );

        /* Set output size for encryption */
        *olen = mbedtls_cipher_get_block_size( ctx );
        return( 0 );
    }
#else
    ((void) output);
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
}